

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

int __thiscall
xercesc_4_0::TraverseSchema::parseBlockSet
          (TraverseSchema *this,DOMElement *elem,int blockType,bool isRoot)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  XMLCh *srcStr;
  long lVar9;
  XMLCh *pXVar10;
  undefined7 in_register_00000009;
  XMLCh *pXVar11;
  XMLCh *pXVar12;
  undefined1 *puVar13;
  XMLStringTokenizer tokenizer;
  XMLStringTokenizer local_60;
  long *plVar8;
  
  if ((int)CONCAT71(in_register_00000009,isRoot) == 0) {
    puVar13 = SchemaSymbols::fgATT_BLOCK;
  }
  else {
    puVar13 = SchemaSymbols::fgATT_BLOCKDEFAULT;
  }
  iVar6 = (*(elem->super_DOMNode)._vptr_DOMNode[0x2a])(elem,puVar13);
  plVar8 = (long *)CONCAT44(extraout_var,iVar6);
  if (plVar8 == (long *)0x0) {
    srcStr = (XMLCh *)0x0;
  }
  else {
    srcStr = (XMLCh *)(**(code **)(*plVar8 + 0x150))(plVar8);
  }
  if (srcStr == (XMLCh *)0x0) {
    uVar7 = this->fSchemaInfo->fBlockDefault;
  }
  else {
    uVar7 = 7;
    if (srcStr != L"#all") {
      lVar9 = 0;
      do {
        psVar1 = (short *)((long)srcStr + lVar9);
        if (*psVar1 == 0) {
          if (*(short *)((long)&SchemaSymbols::fgATTVAL_POUNDALL + lVar9) == 0) {
            return 7;
          }
          break;
        }
        psVar2 = (short *)((long)&SchemaSymbols::fgATTVAL_POUNDALL + lVar9);
        lVar9 = lVar9 + 2;
      } while (*psVar1 == *psVar2);
      XMLStringTokenizer::XMLStringTokenizer(&local_60,srcStr,this->fGrammarPoolMemoryManager);
      uVar7 = 0;
      while (bVar5 = XMLStringTokenizer::hasMoreTokens(&local_60), bVar5) {
        pXVar10 = XMLStringTokenizer::nextToken(&local_60);
        if (pXVar10 == L"substitution") {
          bVar5 = true;
        }
        else {
          pXVar11 = L"substitution";
          if (pXVar10 == (XMLCh *)0x0) {
LAB_00327577:
            bVar5 = *pXVar11 == L'\0';
          }
          else {
            pXVar11 = L"substitution";
            pXVar12 = pXVar10;
            do {
              XVar3 = *pXVar12;
              if (XVar3 == L'\0') goto LAB_00327577;
              pXVar12 = pXVar12 + 1;
              XVar4 = *pXVar11;
              pXVar11 = pXVar11 + 1;
            } while (XVar3 == XVar4);
            bVar5 = false;
          }
        }
        if ((blockType == 0) && (bVar5)) {
          uVar7 = uVar7 | 1;
        }
        else if (pXVar10 == L"extension") {
LAB_00327623:
          uVar7 = uVar7 | 2;
        }
        else {
          pXVar11 = L"extension";
          if (pXVar10 == (XMLCh *)0x0) {
LAB_003275c2:
            if (*pXVar11 == L'\0') goto LAB_00327623;
          }
          else {
            pXVar11 = L"extension";
            pXVar12 = pXVar10;
            do {
              XVar3 = *pXVar12;
              if (XVar3 == L'\0') goto LAB_003275c2;
              pXVar12 = pXVar12 + 1;
              XVar4 = *pXVar11;
              pXVar11 = pXVar11 + 1;
            } while (XVar3 == XVar4);
          }
          if (pXVar10 == L"restriction") {
LAB_00327635:
            uVar7 = uVar7 | 4;
          }
          else {
            pXVar11 = L"restriction";
            if (pXVar10 == (XMLCh *)0x0) {
LAB_003275f2:
              if (*pXVar11 == L'\0') goto LAB_00327635;
            }
            else {
              pXVar11 = L"restriction";
              do {
                XVar3 = *pXVar10;
                if (XVar3 == L'\0') goto LAB_003275f2;
                pXVar10 = pXVar10 + 1;
                XVar4 = *pXVar11;
                pXVar11 = pXVar11 + 1;
              } while (XVar3 == XVar4);
            }
            reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x3f,srcStr,
                              (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
      }
      XMLStringTokenizer::~XMLStringTokenizer(&local_60);
    }
  }
  return uVar7;
}

Assistant:

int TraverseSchema::parseBlockSet(const DOMElement* const elem,
                                  const int blockType, const bool isRoot) {

    const XMLCh* blockVal = (isRoot) ? getElementAttValue(elem, SchemaSymbols::fgATT_BLOCKDEFAULT)
                                     : getElementAttValue(elem, SchemaSymbols::fgATT_BLOCK);

    // blockVal == 0 means 'block attribute is missing'; *blockVal == 0 means 'block="" found'
    if (blockVal == 0)
        return fSchemaInfo->getBlockDefault();

    int blockSet = 0;

    if (XMLString::equals(blockVal, SchemaSymbols::fgATTVAL_POUNDALL)) {

        blockSet = SchemaSymbols::XSD_EXTENSION + SchemaSymbols::XSD_RESTRICTION + SchemaSymbols::XSD_SUBSTITUTION;
        return blockSet;
    }

    XMLStringTokenizer tokenizer(blockVal, fGrammarPoolMemoryManager);

    while (tokenizer.hasMoreTokens()) {

        XMLCh* token = tokenizer.nextToken();

        if (XMLString::equals(token, SchemaSymbols::fgATTVAL_SUBSTITUTION)
            && blockType == ES_Block) {

            if ((blockSet & SchemaSymbols::XSD_SUBSTITUTION) == 0 ) {
                blockSet += SchemaSymbols::XSD_SUBSTITUTION;
            }
        }
        else if (XMLString::equals(token, SchemaSymbols::fgATTVAL_EXTENSION)) {

            if ((blockSet & SchemaSymbols::XSD_EXTENSION) == 0) {
                blockSet += SchemaSymbols::XSD_EXTENSION;
            }
        }
        else if (XMLString::equals(token, SchemaSymbols::fgATTVAL_RESTRICTION)) {

            if ((blockSet & SchemaSymbols::XSD_RESTRICTION) == 0 ) {
                blockSet += SchemaSymbols::XSD_RESTRICTION;
            }
        }
        else {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidBlockValue, blockVal);
        }
    } //end while

    return blockSet;
}